

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::encode_bc1(void *pDst,uint8_t *pPixels,uint32_t flags,uint32_t total_orderings_to_try,
                      uint32_t total_orderings_to_try3)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  anon_union_4_3_898e29d3_for_color32_0 aVar5;
  anon_union_4_3_898e29d3_for_color32_0 aVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  anon_union_4_3_898e29d3_for_color32_0 aVar10;
  uint *puVar11;
  int32_t in_ECX;
  float in_EDX;
  byte *in_RSI;
  uint32_t trial_err_1;
  uint8_t trial_sels_1 [16];
  vec3F xh_2;
  vec3F xl_2;
  int trial_hb_2;
  int trial_hg_2;
  int trial_hr_2;
  int trial_lb_2;
  int trial_lg_2;
  int trial_lr_2;
  uint32_t s;
  uint32_t q;
  uint32_t q_total;
  uint32_t p;
  uint32_t i_3;
  uint32_t b_1;
  uint32_t g_1;
  uint32_t r_1;
  uint32_t b_sum [17];
  uint32_t g_sum [17];
  uint32_t r_sum [17];
  int d;
  int b_2;
  int g_2;
  int r_2;
  uint32_t i_2;
  int dots [16];
  int ab;
  int ag;
  int ar;
  int b3;
  int g3;
  int r3;
  int b0;
  int g0;
  int r0;
  uint32_t orig_total_order_index;
  uint32_t i_1;
  hist4 h;
  uint32_t orig_err;
  uint32_t iter_index;
  uint32_t total_iters;
  uint32_t trial_err;
  uint8_t trial_sels [16];
  vec3F xh_1;
  vec3F xl_1;
  int trial_hb_1;
  int trial_hg_1;
  int trial_hr_1;
  int trial_lb_1;
  int trial_lg_1;
  int trial_lr_1;
  uint32_t ls_pass_1;
  uint32_t total_ls_passes_1;
  uint32_t round_err;
  int orig_round_hb;
  int orig_round_hg;
  int orig_round_hr;
  int orig_round_lb;
  int orig_round_lg;
  int orig_round_lr;
  uint8_t round_sels [16];
  int round_hb;
  int round_hg;
  int round_hr;
  int round_lb;
  int round_lg;
  int round_lr;
  uint32_t modified_flags;
  uint32_t round;
  uint32_t total_rounds;
  vec3F xh;
  vec3F xl;
  int trial_hb;
  int trial_hg;
  int trial_hr;
  int trial_lb;
  int trial_lg;
  int trial_lr;
  uint32_t ls_pass;
  uint32_t total_ls_passes;
  uint32_t cur_err;
  bool needs_block_error;
  int orig_hb;
  int orig_hg;
  int orig_hr;
  int orig_lb;
  int orig_lg;
  int orig_lr;
  int *hb;
  int *hg;
  int *hr;
  int *lb;
  int *lg;
  int *lr;
  uint8_t *sels;
  bc1_encode_results results;
  int b;
  int g;
  int r;
  uint32_t i;
  uint32_t any_black_pixels;
  uint32_t grayscale_flag;
  int total_b;
  int total_g;
  int total_r;
  uint32_t j;
  uint32_t fb;
  uint32_t fg;
  uint32_t fr;
  int max_b;
  int max_g;
  int max_r;
  int min_b;
  int min_g;
  int min_r;
  int avg_b;
  int avg_g;
  int avg_r;
  bc1_block *pDst_block;
  color32 *pSrc_pixels;
  int *in_stack_fffffffffffffb28;
  int hg_00;
  anon_union_4_3_898e29d3_for_color32_0 in_stack_fffffffffffffb30;
  uint32_t in_stack_fffffffffffffb34;
  anon_union_4_3_898e29d3_for_color32_0 in_stack_fffffffffffffb38;
  uint32_t in_stack_fffffffffffffb3c;
  uint in_stack_fffffffffffffb40;
  uint32_t in_stack_fffffffffffffb44;
  uint in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  uint in_stack_fffffffffffffb50;
  uint32_t in_stack_fffffffffffffb54;
  uint in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  vec3F *in_stack_fffffffffffffb60;
  vec3F *pXh;
  vec3F *in_stack_fffffffffffffb68;
  vec3F *pXl;
  anon_union_4_3_898e29d3_for_color32_0 *in_stack_fffffffffffffb70;
  anon_union_4_3_898e29d3_for_color32_0 *pSelectors;
  anon_union_4_3_898e29d3_for_color32_0 *in_stack_fffffffffffffb78;
  anon_union_4_3_898e29d3_for_color32_0 *pColors;
  int in_stack_fffffffffffffb90;
  uint local_460;
  uint local_45c;
  undefined8 in_stack_fffffffffffffba8;
  uint32_t in_stack_fffffffffffffbb0;
  uint32_t in_stack_fffffffffffffbb4;
  undefined1 *in_stack_fffffffffffffbb8;
  undefined1 *puVar12;
  uint32_t cur_err_00;
  anon_union_4_3_898e29d3_for_color32_0 *in_stack_fffffffffffffbc0;
  anon_union_4_3_898e29d3_for_color32_0 *results_00;
  anon_union_4_3_898e29d3_for_color32_0 *in_stack_fffffffffffffbc8;
  anon_union_4_3_898e29d3_for_color32_0 *in_stack_fffffffffffffbd0;
  vec3F *sels_00;
  bool local_410;
  bool local_40f;
  bool local_40e;
  bool local_40d;
  undefined8 local_408;
  undefined8 local_400;
  vec3F local_3f8;
  vec3F local_3ec;
  uint local_3e0;
  anon_union_4_3_898e29d3_for_color32_0 local_3dc;
  anon_union_4_3_898e29d3_for_color32_0 local_3d8;
  anon_union_4_3_898e29d3_for_color32_0 local_3d4;
  float local_3d0;
  float local_3cc;
  uint local_3c8;
  uint local_3c4;
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint32_t local_3b4;
  int local_3b0;
  uint32_t local_3ac;
  uint32_t local_3a8 [16];
  uint local_368;
  bc1_encode_results *in_stack_fffffffffffffca8;
  uint32_t *in_stack_fffffffffffffcb0;
  uint32_t in_stack_fffffffffffffcbc;
  color32 *in_stack_fffffffffffffcc0;
  uint32_t local_308 [16];
  uint local_2c8;
  int local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8 [11];
  int in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffd9c;
  int in_stack_fffffffffffffda0;
  uint in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdc0;
  hist4 local_23c;
  anon_union_4_3_898e29d3_for_color32_0 in_stack_fffffffffffffdc8;
  uint local_234;
  uint in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd8;
  undefined4 uStack_224;
  int in_stack_fffffffffffffde0;
  undefined4 uStack_21c;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffdfc;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  uint in_stack_fffffffffffffe10;
  anon_union_4_3_898e29d3_for_color32_0 in_stack_fffffffffffffe14;
  anon_union_4_3_898e29d3_for_color32_0 in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe1c;
  float in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  anon_union_4_3_898e29d3_for_color32_0 local_1d4;
  undefined8 local_1b8;
  undefined8 local_1b0;
  uint local_19c;
  uint local_198;
  anon_union_4_3_898e29d3_for_color32_0 local_194;
  anon_union_4_3_898e29d3_for_color32_0 local_190;
  undefined1 local_18c [8];
  float local_184;
  uint local_180;
  uint local_17c;
  vec3F local_178;
  vec3F local_16c;
  uint local_160;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0 local_15c;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0 local_158;
  uint local_154;
  float local_150;
  float local_14c;
  uint local_148;
  uint local_144;
  anon_union_4_3_898e29d3_for_color32_0 local_140;
  bool local_139;
  uint local_138;
  anon_union_4_3_898e29d3_for_color32_0 local_134;
  anon_union_4_3_898e29d3_for_color32_0 local_130;
  anon_union_4_3_898e29d3_for_color32_0 local_12c;
  float local_128;
  float local_124;
  uint *local_120;
  anon_union_4_3_898e29d3_for_color32_0 *local_118;
  anon_union_4_3_898e29d3_for_color32_0 *local_110;
  anon_union_4_3_898e29d3_for_color32_0 *local_108;
  vec3F *local_100;
  vec3F *local_f8;
  undefined8 *local_f0;
  undefined1 local_e4 [8];
  anon_union_4_3_898e29d3_for_color32_0 local_dc;
  anon_union_4_3_898e29d3_for_color32_0 local_d8;
  anon_union_4_3_898e29d3_for_color32_0 local_d4;
  uint local_d0;
  undefined8 local_cc [2];
  byte local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  anon_union_4_3_898e29d3_for_color32_0 local_68;
  anon_union_4_3_898e29d3_for_color32_0 local_64;
  byte *local_58;
  int32_t local_48;
  float local_44;
  
  puVar12 = &stack0xfffffffffffffb18;
  local_98 = (uint)*in_RSI;
  local_9c = (uint)in_RSI[1];
  local_a0 = (uint)in_RSI[2];
  local_94 = 0xf;
  while ((((local_94 != 0 && (in_RSI[(ulong)local_94 * 4] == local_98)) &&
          (in_RSI[(ulong)local_94 * 4 + 1] == local_9c)) &&
         (in_RSI[(ulong)local_94 * 4 + 2] == local_a0))) {
    local_94 = local_94 - 1;
  }
  local_90 = local_a0;
  local_8c = local_9c;
  local_88 = local_98;
  if (local_94 == 0) {
    encode_bc1_solid_block
              ((void *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38.m,in_stack_fffffffffffffb34,
               (bool)in_stack_fffffffffffffb30.field_0.a);
  }
  else {
    local_40d = local_98 == local_9c && local_98 == local_a0;
    local_a4 = (uint)local_40d;
    local_a8 = (uint)((byte)(*in_RSI | in_RSI[1] | in_RSI[2]) < 4);
    local_84 = local_a0;
    local_80 = local_9c;
    local_7c = local_98;
    local_78 = local_a0;
    local_74 = local_9c;
    local_70 = local_98;
    local_58 = in_RSI;
    local_48 = in_ECX;
    local_44 = in_EDX;
    for (local_ac = 1; local_ac < 0x10; local_ac = local_ac + 1) {
      local_b0 = (uint)local_58[(ulong)local_ac * 4];
      local_b4 = (uint)local_58[(ulong)local_ac * 4 + 1];
      local_b8 = (uint)local_58[(ulong)local_ac * 4 + 2];
      local_40e = local_b0 == local_b4 && local_b0 == local_b8;
      local_a4 = local_40e & local_a4;
      local_a8 = (byte)(local_58[(ulong)local_ac * 4] | local_58[(ulong)local_ac * 4 + 1] |
                       local_58[(ulong)local_ac * 4 + 2]) < 4 | local_a8;
      puVar11 = (uint *)std::max<int>((int *)&local_7c,(int *)&local_b0);
      local_7c = *puVar11;
      puVar11 = (uint *)std::max<int>((int *)&local_80,(int *)&local_b4);
      local_80 = *puVar11;
      puVar11 = (uint *)std::max<int>((int *)&local_84,(int *)&local_b8);
      local_84 = *puVar11;
      puVar11 = (uint *)std::min<int>((int *)&local_70,(int *)&local_b0);
      local_70 = *puVar11;
      puVar11 = (uint *)std::min<int>((int *)&local_74,(int *)&local_b4);
      local_74 = *puVar11;
      puVar11 = (uint *)std::min<int>((int *)&local_78,(int *)&local_b8);
      local_78 = *puVar11;
      local_98 = local_b0 + local_98;
      local_9c = local_b4 + local_9c;
      local_a0 = local_b8 + local_a0;
    }
    aVar5.m = (int)(local_98 + 8) >> 4;
    aVar6.m = (int)(local_9c + 8) >> 4;
    uVar7 = (int)(local_a0 + 8) >> 4;
    local_bc = 0;
    local_f0 = local_cc;
    pXh = (vec3F *)local_e4;
    pXl = (vec3F *)(local_e4 + 4);
    pSelectors = &local_dc;
    pColors = &local_d8;
    results_00 = &local_d4;
    local_120 = &local_d0;
    local_124 = 0.0;
    local_128 = 0.0;
    local_12c.m = 0;
    local_130.m = 0;
    local_134.m = 0;
    local_138 = 0;
    local_e4._0_4_ = 0.0;
    local_e4._4_4_ = 0.0;
    local_dc.m = 0;
    local_d8.m = 0;
    local_d4.m = 0;
    local_40f = true;
    if (((uint)local_44 & 0xffc00112) == 0) {
      local_410 = local_a8 != 0 && ((uint)local_44 & 8) != 0;
      local_40f = local_410;
    }
    local_139 = local_40f;
    local_140.m = 0xffffffff;
    local_118 = results_00;
    local_110 = pColors;
    local_108 = pSelectors;
    local_100 = pXl;
    local_f8 = pXh;
    local_6c = uVar7;
    local_68.m = aVar6.m;
    local_64.m = aVar5.m;
    if (local_40f == false) {
      in_stack_fffffffffffffb28 =
           (int *)CONCAT44((int)((ulong)in_stack_fffffffffffffb28 >> 0x20),local_84);
      in_stack_fffffffffffffb48 = local_98;
      in_stack_fffffffffffffb50 = local_9c;
      in_stack_fffffffffffffb58 = local_a0;
      in_stack_fffffffffffffbc8 = pColors;
      in_stack_fffffffffffffbd0 = pSelectors;
      sels_00 = pXl;
      encode_bc1_pick_initial
                ((color32 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 in_stack_fffffffffffffd9c,SUB41((uint)in_stack_fffffffffffffd98 >> 0x18,0),
                 in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                 in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdc8.m,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,
                 (int *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (int *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (int *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 (int *)CONCAT44(in_stack_fffffffffffffe14.m,in_stack_fffffffffffffe10),
                 (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18.m),
                 (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      local_124 = local_f8->c[0];
      local_128 = local_100->c[0];
      local_12c.m = *(uint32_t *)local_108;
      local_130.field_0 =
           *(anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0 *)local_110;
      local_134.field_0 =
           *(anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0 *)local_118;
      local_138 = *local_120;
      bc1_find_sels4_noerr
                ((color32 *)&results_00->field_0,(uint32_t)((ulong)puVar12 >> 0x20),
                 (uint32_t)puVar12,in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                 (uint32_t)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffbd0,(uint8_t *)sels_00);
      local_144 = 1;
      if (((uint)local_44 & 4) != 0) {
        local_144 = 2;
      }
      for (local_148 = 0; local_148 < local_144; local_148 = local_148 + 1) {
        bVar4 = compute_least_squares_endpoints4_rgb
                          ((color32 *)&pColors->field_0,pSelectors->c,pXl,pXh,
                           in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,
                           in_stack_fffffffffffffb90);
        if (bVar4) {
          precise_round_565(&local_16c,&local_178,(int *)&local_158,(int *)&local_15c,
                            (int *)&local_160,(int *)&local_14c,(int *)&local_150,(int *)&local_154)
          ;
        }
        else {
          local_14c = (float)(uint)(byte)g_bc1_match5_equals_1[(long)(int)local_64.m * 3];
          local_150 = (float)(uint)(byte)g_bc1_match6_equals_1[(long)(int)local_68.m * 3];
          local_154 = (uint)(byte)g_bc1_match5_equals_1[(long)(int)local_6c * 3];
          local_158.g = '\0';
          local_158.b = '\0';
          local_158.a = '\0';
          local_158.r = g_bc1_match5_equals_1[(long)(int)local_64.m * 3 + 1];
          local_15c.g = '\0';
          local_15c.b = '\0';
          local_15c.a = '\0';
          local_15c.r = g_bc1_match6_equals_1[(long)(int)local_68.m * 3 + 1];
          local_160 = (uint)(byte)g_bc1_match5_equals_1[(long)(int)local_6c * 3 + 1];
        }
        if (((((local_f8->c[0] == local_14c) && (local_100->c[0] == local_150)) &&
             (local_108->m == local_154)) &&
            (((anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)local_110->m ==
              local_158 &&
             ((anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)local_118->m ==
              local_15c)))) && (*local_120 == local_160)) break;
        bc1_find_sels4_noerr
                  ((color32 *)&results_00->field_0,(uint32_t)((ulong)puVar12 >> 0x20),
                   (uint32_t)puVar12,in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0,
                   (uint32_t)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffbd0,(uint8_t *)sels_00);
        local_f8->c[0] = local_14c;
        local_100->c[0] = local_150;
        local_108->m = local_154;
        local_110->m = (uint32_t)local_158;
        local_118->m = (uint32_t)local_15c;
        *local_120 = local_160;
      }
    }
    else {
      local_17c = 1;
      if (((uint)local_44 & 0x4000) != 0) {
        local_17c = 2;
      }
      for (local_180 = 0; aVar5 = in_stack_fffffffffffffb30, aVar6 = in_stack_fffffffffffffb38,
          uVar7 = in_stack_fffffffffffffb40, pXh = in_stack_fffffffffffffb60,
          pXl = in_stack_fffffffffffffb68, pSelectors = in_stack_fffffffffffffb70,
          pColors = in_stack_fffffffffffffb78, puVar12 = in_stack_fffffffffffffbb8,
          results_00 = in_stack_fffffffffffffbc0, local_180 < local_17c; local_180 = local_180 + 1)
      {
        local_184 = local_44;
        if (local_180 == 1) {
          local_184 = (float)((uint)local_44 & 0xfffffdbf | 0x40);
        }
        in_stack_fffffffffffffb78 = &local_194;
        in_stack_fffffffffffffb70 = &local_190;
        in_stack_fffffffffffffb68 = (vec3F *)local_18c;
        in_stack_fffffffffffffb60 = (vec3F *)(local_18c + 4);
        in_stack_fffffffffffffb38 = local_68;
        in_stack_fffffffffffffb40 = local_6c;
        in_stack_fffffffffffffb48 = local_98;
        in_stack_fffffffffffffb50 = local_9c;
        in_stack_fffffffffffffb58 = local_a0;
        encode_bc1_pick_initial
                  ((color32 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   in_stack_fffffffffffffd9c,SUB41((uint)in_stack_fffffffffffffd98 >> 0x18,0),
                   in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                   in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdc8.m,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,
                   in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,
                   (int *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (int *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (int *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (int *)CONCAT44(in_stack_fffffffffffffe14.m,in_stack_fffffffffffffe10),
                   (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18.m),
                   (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        uVar3 = local_18c._4_4_;
        uVar2 = local_18c._0_4_;
        aVar6 = local_190;
        aVar5 = local_194;
        uVar1 = local_198;
        uVar7 = local_19c;
        in_stack_fffffffffffffb28 = (int *)&local_1b8;
        in_stack_fffffffffffffb30.m = 0xffffffff;
        local_1d4.m = bc1_find_sels4(in_stack_fffffffffffffb54,
                                     (color32 *)
                                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                                     in_stack_fffffffffffffb44,in_stack_fffffffffffffb40,
                                     in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38.m,
                                     (uint32_t)in_stack_fffffffffffffb60,
                                     (uint32_t)in_stack_fffffffffffffb68,
                                     in_stack_fffffffffffffb70->c,
                                     (uint32_t)in_stack_fffffffffffffb78);
        uVar8 = 1;
        if (((uint)local_44 & 4) != 0) {
          uVar8 = 2;
        }
        for (in_stack_fffffffffffffe24 = 0; in_stack_fffffffffffffe24 < uVar8;
            in_stack_fffffffffffffe24 = in_stack_fffffffffffffe24 + 1) {
          bVar4 = compute_least_squares_endpoints4_rgb
                            ((color32 *)&in_stack_fffffffffffffb78->field_0,
                             in_stack_fffffffffffffb70->c,in_stack_fffffffffffffb68,
                             in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                             in_stack_fffffffffffffb58,in_stack_fffffffffffffb90);
          if (bVar4) {
            precise_round_565((vec3F *)&stack0xfffffffffffffe00,(vec3F *)&stack0xfffffffffffffdf4,
                              (int *)&stack0xfffffffffffffe14,(int *)&stack0xfffffffffffffe10,
                              (int *)&stack0xfffffffffffffe0c,(int *)&stack0xfffffffffffffe20,
                              (int *)&stack0xfffffffffffffe1c,(int *)&stack0xfffffffffffffe18);
          }
          else {
            in_stack_fffffffffffffe20 =
                 (float)(uint)(byte)g_bc1_match5_equals_1[(long)(int)local_64.m * 3];
            in_stack_fffffffffffffe1c =
                 (float)(uint)(byte)g_bc1_match6_equals_1[(long)(int)local_68.m * 3];
            in_stack_fffffffffffffe18.m._1_3_ = 0;
            in_stack_fffffffffffffe18.field_0.r = g_bc1_match5_equals_1[(long)(int)local_6c * 3];
            in_stack_fffffffffffffe14.m._1_3_ = 0;
            in_stack_fffffffffffffe14.field_0.r =
                 g_bc1_match5_equals_1[(long)(int)local_64.m * 3 + 1];
            in_stack_fffffffffffffe10 =
                 (uint)(byte)g_bc1_match6_equals_1[(long)(int)local_68.m * 3 + 1];
            in_stack_fffffffffffffe0c =
                 (uint)(byte)g_bc1_match5_equals_1[(long)(int)local_6c * 3 + 1];
          }
          if (((((float)local_18c._4_4_ == in_stack_fffffffffffffe20) &&
               ((float)local_18c._0_4_ == in_stack_fffffffffffffe1c)) &&
              ((local_190.m == in_stack_fffffffffffffe18.m &&
               ((local_194.m == in_stack_fffffffffffffe14.m &&
                (local_198 == in_stack_fffffffffffffe10)))))) &&
             (local_19c == in_stack_fffffffffffffe0c)) break;
          in_stack_fffffffffffffb28 = (int *)&stack0xfffffffffffffdd8;
          in_stack_fffffffffffffb30 = local_1d4;
          aVar10.m = bc1_find_sels4(in_stack_fffffffffffffb54,
                                    (color32 *)
                                    CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                                    in_stack_fffffffffffffb44,in_stack_fffffffffffffb40,
                                    in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38.m,
                                    (uint32_t)in_stack_fffffffffffffb60,
                                    (uint32_t)in_stack_fffffffffffffb68,in_stack_fffffffffffffb70->c
                                    ,(uint32_t)in_stack_fffffffffffffb78);
          if (local_1d4.m <= aVar10.m) break;
          local_1b8 = CONCAT44(uStack_224,in_stack_fffffffffffffdd8);
          local_1b0 = CONCAT44(uStack_21c,in_stack_fffffffffffffde0);
          local_1d4.m = aVar10.m;
          local_19c = in_stack_fffffffffffffe0c;
          local_198 = in_stack_fffffffffffffe10;
          local_194 = in_stack_fffffffffffffe14;
          local_190 = in_stack_fffffffffffffe18;
          local_18c._0_4_ = in_stack_fffffffffffffe1c;
          local_18c._4_4_ = in_stack_fffffffffffffe20;
        }
        if (local_1d4.m <= local_140.m) {
          local_140.field_0 = local_1d4.field_0;
          local_f8->c[0] = (float)local_18c._4_4_;
          local_100->c[0] = (float)local_18c._0_4_;
          local_108->m = (uint32_t)local_190;
          local_110->m = (uint32_t)local_194;
          local_118->m = local_198;
          *local_120 = local_19c;
          local_124 = (float)uVar3;
          local_128 = (float)uVar2;
          local_12c.field_0 = aVar6.field_0;
          local_130.field_0 = aVar5.field_0;
          local_134.m = uVar1;
          local_138 = uVar7;
          *local_f0 = local_1b8;
          local_f0[1] = local_1b0;
        }
      }
    }
    cur_err_00 = (uint32_t)((ulong)puVar12 >> 0x20);
    if ((local_140.m != 0) && (((uint)local_44 & 2) != 0)) {
      in_stack_fffffffffffffdd0 = 1;
      if (((uint)local_44 & 0x20) != 0) {
        in_stack_fffffffffffffdd0 = 2;
      }
      for (local_234 = 0; cur_err_00 = (uint32_t)((ulong)puVar12 >> 0x20),
          local_234 < in_stack_fffffffffffffdd0; local_234 = local_234 + 1) {
        in_stack_fffffffffffffdc8 = local_140;
        hist4::hist4((hist4 *)0x12eb10);
        for (in_stack_fffffffffffffdc0 = 0; in_stack_fffffffffffffdc0 < 0x10;
            in_stack_fffffffffffffdc0 = in_stack_fffffffffffffdc0 + 1) {
          local_23c.m_hist[*(byte *)((long)local_f0 + (ulong)in_stack_fffffffffffffdc0)] =
               local_23c.m_hist[*(byte *)((long)local_f0 + (ulong)in_stack_fffffffffffffdc0)] +
               '\x01';
        }
        uVar9 = hist4::lookup_total_ordering_index(&local_23c);
        uVar1 = local_108->m;
        uVar8 = local_108->m;
        in_stack_fffffffffffffda4 = *local_120 << 3 | (int)*local_120 >> 2;
        in_stack_fffffffffffffda0 =
             (local_110->m << 3 | (int)local_110->m >> 2) -
             ((int)local_f8->c[0] << 3 | (int)local_f8->c[0] >> 2);
        in_stack_fffffffffffffd9c =
             (local_118->m << 2 | (int)local_118->m >> 4) -
             ((int)local_100->c[0] << 2 | (int)local_100->c[0] >> 4);
        for (local_2ac = 0; local_2ac < 0x10; local_2ac = local_2ac + 1) {
          local_2b0 = (uint)local_58[(ulong)local_2ac * 4];
          local_2b4 = (uint)local_58[(ulong)local_2ac * 4 + 1];
          local_2b8 = (uint)local_58[(ulong)local_2ac * 4 + 2];
          local_2bc = local_2b0 * in_stack_fffffffffffffda0 + local_2b4 * in_stack_fffffffffffffd9c
                      + local_2b8 * (in_stack_fffffffffffffda4 - (uVar1 << 3 | (int)uVar8 >> 2)) +
                      0x1000000;
          local_2a8[local_2ac] = local_2bc * 0x10 + local_2ac;
        }
        std::sort<int*>((int *)CONCAT44(in_stack_fffffffffffffb34,aVar5.m),in_stack_fffffffffffffb28
                       );
        local_3ac = 0;
        local_3b0 = 0;
        local_3b4 = 0;
        for (local_3b8 = 0; local_3b8 < 0x10; local_3b8 = local_3b8 + 1) {
          local_3bc = local_2a8[local_3b8] & 0xf;
          local_308[local_3b8] = local_3ac;
          *(int *)(&stack0xfffffffffffffca8 + (ulong)local_3b8 * 4) = local_3b0;
          local_3a8[local_3b8] = local_3b4;
          local_3ac = local_58[(ulong)local_3bc * 4] + local_3ac;
          local_3b0 = (uint)local_58[(ulong)local_3bc * 4 + 1] + local_3b0;
          local_3b4 = local_58[(ulong)local_3bc * 4 + 2] + local_3b4;
        }
        local_2c8 = local_98;
        local_368 = local_a0;
        if (((uint)local_44 & 0x2000) == 0) {
          local_45c = clampi(local_48,1,0x80);
        }
        else {
          local_45c = 0x3c9;
        }
        local_3c0 = local_45c;
        for (local_3c4 = 0; cur_err_00 = (uint32_t)((ulong)puVar12 >> 0x20), local_3c4 < local_3c0;
            local_3c4 = local_3c4 + 1) {
          if (((uint)local_44 & 0x2000) == 0) {
            local_460 = (uint)*(ushort *)
                               (g_best_total_orderings4 +
                               (ulong)local_3c4 * 2 + (ulong)uVar9 * 0x100);
          }
          else {
            local_460 = local_3c4;
          }
          local_3c8 = local_460;
          if ((((local_460 == 0xf) || (local_460 == 700)) || (local_460 == 0x2f1)) ||
             (local_460 == 0x203)) {
            local_3cc = (float)(uint)(byte)g_bc1_match5_equals_1[(long)(int)local_64.m * 3];
            local_3d0 = (float)(uint)(byte)g_bc1_match6_equals_1[(long)(int)local_68.m * 3];
            local_3d4.m._1_3_ = 0;
            local_3d4.field_0.r = g_bc1_match5_equals_1[(long)(int)local_6c * 3];
            local_3d8.m._1_3_ = 0;
            local_3d8.field_0.r = g_bc1_match5_equals_1[(long)(int)local_64.m * 3 + 1];
            local_3dc.m._1_3_ = 0;
            local_3dc.field_0.r = g_bc1_match6_equals_1[(long)(int)local_68.m * 3 + 1];
            local_3e0 = (uint)(byte)g_bc1_match5_equals_1[(long)(int)local_6c * 3 + 1];
          }
          else {
            compute_least_squares_endpoints4_rgb
                      (&local_3ec,&local_3f8,local_98,local_9c,local_a0,
                       *(float *)(g_selector_factors4 + (ulong)local_460 * 0xc),
                       *(float *)(g_selector_factors4 + (ulong)local_460 * 0xc + 4),
                       *(float *)(g_selector_factors4 + (ulong)local_460 * 0xc + 8),local_460,
                       local_308,(uint32_t *)&stack0xfffffffffffffca8,local_3a8);
            precise_round_565(&local_3ec,&local_3f8,(int *)&local_3d8.m,(int *)&local_3dc.m,
                              (int *)&local_3e0,(int *)&local_3cc,(int *)&local_3d0,
                              (int *)&local_3d4.m);
          }
          in_stack_fffffffffffffb28 = (int *)&local_408;
          aVar5 = local_140;
          aVar10.m = bc1_find_sels4(in_stack_fffffffffffffb54,
                                    (color32 *)
                                    CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                                    in_stack_fffffffffffffb44,uVar7,in_stack_fffffffffffffb3c,
                                    aVar6.m,(uint32_t)pXh,(uint32_t)pXl,pSelectors->c,
                                    (uint32_t)pColors);
          if (aVar10.m < local_140.m) {
            local_f8->c[0] = local_3cc;
            local_100->c[0] = local_3d0;
            *local_108 = local_3d4;
            *local_110 = local_3d8;
            *local_118 = local_3dc;
            *local_120 = local_3e0;
            *local_f0 = local_408;
            local_f0[1] = local_400;
            local_140.m = aVar10.m;
          }
        }
        if ((local_140.m == 0) || (local_140.m == in_stack_fffffffffffffdc8.m)) break;
      }
    }
    hg_00 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
    if ((((uint)local_44 & 0x18) != 0) && (local_140.m != 0)) {
      if (((uint)local_44 & 0x10) != 0) {
        aVar5 = local_130;
        aVar6 = local_134;
        uVar7 = local_138;
        in_stack_fffffffffffffb50 = local_9c;
        in_stack_fffffffffffffb58 = local_a0;
        try_3color_block((color32 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         in_stack_fffffffffffffd9c,
                         (uint32_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,
                         in_stack_fffffffffffffd84,in_stack_fffffffffffffdc0,
                         in_stack_fffffffffffffdc8.m,in_stack_fffffffffffffdd0,
                         in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,
                         (int)in_stack_fffffffffffffdf8,(int)in_stack_fffffffffffffe00,
                         (uint32_t)in_stack_fffffffffffffe08,
                         (bc1_encode_results *)
                         CONCAT44(in_stack_fffffffffffffe14.m,in_stack_fffffffffffffe10));
      }
      if ((local_a8 != 0) && (((uint)local_44 & 8) != 0)) {
        try_3color_block_useblack
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb0,
                   in_stack_fffffffffffffca8);
      }
    }
    if ((((uint)local_44 & 0xffc00000) != 0) && (local_140.m != 0)) {
      encode_bc1_endpoint_search
                ((color32 *)&in_stack_fffffffffffffbd0->field_0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0),
                 (uint32_t)in_stack_fffffffffffffbc8,(bc1_encode_results *)&results_00->field_0,
                 cur_err_00);
    }
    if ((local_bc & 1) == 0) {
      bc1_encode4((bc1_block *)CONCAT44(in_stack_fffffffffffffb44,uVar7),in_stack_fffffffffffffb3c,
                  aVar6.m,in_stack_fffffffffffffb34,aVar5.m,hg_00,in_stack_fffffffffffffb50,
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    }
    else {
      bc1_encode3((bc1_block *)CONCAT44(in_stack_fffffffffffffb44,uVar7),in_stack_fffffffffffffb3c,
                  aVar6.m,in_stack_fffffffffffffb34,aVar5.m,hg_00,in_stack_fffffffffffffb50,
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    }
  }
  return;
}

Assistant:

void encode_bc1(void* pDst, const uint8_t* pPixels, uint32_t flags, uint32_t total_orderings_to_try, uint32_t total_orderings_to_try3)
	{
		assert(g_initialized);
				
		const color32* pSrc_pixels = (const color32*)pPixels;
		bc1_block* pDst_block = static_cast<bc1_block*>(pDst);
		
		int avg_r, avg_g, avg_b, min_r, min_g, min_b, max_r, max_g, max_b;
						
		const uint32_t fr = pSrc_pixels[0].r, fg = pSrc_pixels[0].g, fb = pSrc_pixels[0].b;

		uint32_t j;
		for (j = 15; j >= 1; --j)
			if ((pSrc_pixels[j].r != fr) || (pSrc_pixels[j].g != fg) || (pSrc_pixels[j].b != fb))
				break;

		if (j == 0)
		{
			encode_bc1_solid_block(pDst, fr, fg, fb, (flags & (cEncodeBC1Use3ColorBlocks | cEncodeBC1Use3ColorBlocksForBlackPixels)) != 0);
			return;
		}

		int total_r = fr, total_g = fg, total_b = fb;
		
		max_r = fr, max_g = fg, max_b = fb;
		min_r = fr, min_g = fg, min_b = fb;
		
		uint32_t grayscale_flag = (fr == fg) && (fr == fb);
		uint32_t any_black_pixels = (fr | fg | fb) < 4;

		for (uint32_t i = 1; i < 16; i++)
		{
			const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
			
			grayscale_flag &= ((r == g) && (r == b));
			any_black_pixels |= ((r | g | b) < 4);

			max_r = std::max(max_r, r); max_g = std::max(max_g, g); max_b = std::max(max_b, b);
			min_r = std::min(min_r, r); min_g = std::min(min_g, g); min_b = std::min(min_b, b);
			total_r += r; total_g += g; total_b += b;
		}

		avg_r = (total_r + 8) >> 4, avg_g = (total_g + 8) >> 4, avg_b = (total_b + 8) >> 4;

		bc1_encode_results results;
		results.m_3color = false;

		uint8_t *sels = results.sels;
		int &lr = results.lr, &lg = results.lg, &lb = results.lb, &hr = results.hr, &hg = results.hg, &hb = results.hb;
		int orig_lr = 0, orig_lg = 0, orig_lb = 0, orig_hr = 0, orig_hg = 0, orig_hb = 0;

		lr = 0, lg = 0, lb = 0, hr = 0, hg = 0, hb = 0;
								
		const bool needs_block_error = ((flags & (cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use3ColorBlocks | cEncodeBC1UseFullMSEEval | cEncodeBC1EndpointSearchRoundsMask)) != 0) ||
				(any_black_pixels && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0));
		
		uint32_t cur_err = UINT32_MAX;

		if (!needs_block_error)
		{
			assert((flags & cEncodeBC1TryAllInitialEndponts) == 0);

			encode_bc1_pick_initial(pSrc_pixels, flags, grayscale_flag != 0,
					min_r, min_g, min_b, max_r, max_g, max_b, 
					avg_r, avg_g, avg_b, total_r, total_g, total_b,
					lr, lg, lb, hr, hg, hb);

			orig_lr = lr, orig_lg = lg, orig_lb = lb, orig_hr = hr, orig_hg = hg, orig_hb = hb;

			bc1_find_sels4_noerr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);

			const uint32_t total_ls_passes = flags & cEncodeBC1TwoLeastSquaresPasses ? 2 : 1;
			for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
			{
				int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

				vec3F xl, xh;
				if (!compute_least_squares_endpoints4_rgb(pSrc_pixels, sels, &xl, &xh, total_r, total_g, total_b))
				{
					// All selectors equal - treat it as a solid block which should always be equal or better.
					trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
					trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
					trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

					trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
					trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
					trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;

					// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
				}
				else
				{
					precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
				}

				if ((lr == trial_lr) && (lg == trial_lg) && (lb == trial_lb) && (hr == trial_hr) && (hg == trial_hg) && (hb == trial_hb))
					break;
			
				bc1_find_sels4_noerr(pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, sels);

				lr = trial_lr;
				lg = trial_lg;
				lb = trial_lb;
				hr = trial_hr;
				hg = trial_hg;
				hb = trial_hb;

			} // ls_pass
		}
		else
		{
			const uint32_t total_rounds = (flags & cEncodeBC1TryAllInitialEndponts) ? 2 : 1;
			for (uint32_t round = 0; round < total_rounds; round++)
			{
				uint32_t modified_flags = flags;
				if (round == 1)
				{
					modified_flags &= ~(cEncodeBC1Use2DLS | cEncodeBC1BoundingBox);
					modified_flags |= cEncodeBC1BoundingBox;
				}

				int round_lr, round_lg, round_lb, round_hr, round_hg, round_hb;
				uint8_t round_sels[16];

				encode_bc1_pick_initial(pSrc_pixels, modified_flags, grayscale_flag != 0,
					min_r, min_g, min_b, max_r, max_g, max_b, 
					avg_r, avg_g, avg_b, total_r, total_g, total_b,
					round_lr, round_lg, round_lb, round_hr, round_hg, round_hb);

				int orig_round_lr = round_lr, orig_round_lg = round_lg, orig_round_lb = round_lb, orig_round_hr = round_hr, orig_round_hg = round_hg, orig_round_hb = round_hb;

				uint32_t round_err = bc1_find_sels4(flags, pSrc_pixels, round_lr, round_lg, round_lb, round_hr, round_hg, round_hb, round_sels, UINT32_MAX);
						
				const uint32_t total_ls_passes = flags & cEncodeBC1TwoLeastSquaresPasses ? 2 : 1;
				for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
				{
					int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

					vec3F xl, xh;
					if (!compute_least_squares_endpoints4_rgb(pSrc_pixels, round_sels, &xl, &xh, total_r, total_g, total_b))
					{
						// All selectors equal - treat it as a solid block which should always be equal or better.
						trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
						trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
						trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

						trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
						trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
						trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;

						// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
					}
					else
					{
						precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
					}

					if ((round_lr == trial_lr) && (round_lg == trial_lg) && (round_lb == trial_lb) && (round_hr == trial_hr) && (round_hg == trial_hg) && (round_hb == trial_hb))
						break;
			
					uint8_t trial_sels[16];
					uint32_t trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, round_err);
														
					if (trial_err < round_err)
					{
						round_lr = trial_lr;
						round_lg = trial_lg;
						round_lb = trial_lb;

						round_hr = trial_hr;
						round_hg = trial_hg;
						round_hb = trial_hb;

						round_err = trial_err;
						memcpy(round_sels, trial_sels, 16);
					}
					else
						break;

				} // ls_pass

				if (round_err <= cur_err)
				{
					cur_err = round_err;
				
					lr = round_lr;
					lg = round_lg;
					lb = round_lb;
					hr = round_hr;
					hg = round_hg;
					hb = round_hb;

					orig_lr = orig_round_lr;
					orig_lg = orig_round_lg;
					orig_lb = orig_round_lb;
					orig_hr = orig_round_hr;
					orig_hg = orig_round_hg;
					orig_hb = orig_round_hb;

					memcpy(sels, round_sels, 16);
				}

			} // round
		}
				
		if ((cur_err) && (flags & cEncodeBC1UseLikelyTotalOrderings))
		{
			assert(needs_block_error);

			const uint32_t total_iters = (flags & cEncodeBC1Iterative) ? 2 : 1;
			for (uint32_t iter_index = 0; iter_index < total_iters; iter_index++)
			{
				const uint32_t orig_err = cur_err;
								
				hist4 h;
				for (uint32_t i = 0; i < 16; i++)
				{
					assert(sels[i] < 4);
					h.m_hist[sels[i]]++;
				}

				const uint32_t orig_total_order_index = h.lookup_total_ordering_index();

				int r0, g0, b0, r3, g3, b3;
				r0 = (lr << 3) | (lr >> 2); g0 = (lg << 2) | (lg >> 4); b0 = (lb << 3) | (lb >> 2);
				r3 = (hr << 3) | (hr >> 2); g3 = (hg << 2) | (hg >> 4); b3 = (hb << 3) | (hb >> 2);
										
				int ar = r3 - r0, ag = g3 - g0, ab = b3 - b0;
												
				int dots[16];
				for (uint32_t i = 0; i < 16; i++)
				{
					int r = pSrc_pixels[i].r;
					int g = pSrc_pixels[i].g;
					int b = pSrc_pixels[i].b;
					int d = 0x1000000 + (r * ar + g * ag + b * ab);
					assert(d >= 0);
					dots[i] = (d << 4) + i;
				}

				std::sort(dots, dots + 16);
								
				uint32_t r_sum[17], g_sum[17], b_sum[17];
				uint32_t r = 0, g = 0, b = 0;
				for (uint32_t i = 0; i < 16; i++)
				{
					const uint32_t p = dots[i] & 15;

					r_sum[i] = r;
					g_sum[i] = g;
					b_sum[i] = b;
										
					r += pSrc_pixels[p].r;
					g += pSrc_pixels[p].g;
					b += pSrc_pixels[p].b;
				}

				r_sum[16] = total_r;
				g_sum[16] = total_g;
				b_sum[16] = total_b;

				const uint32_t q_total = (flags & cEncodeBC1Exhaustive) ? NUM_UNIQUE_TOTAL_ORDERINGS4 : clampi(total_orderings_to_try, MIN_TOTAL_ORDERINGS, MAX_TOTAL_ORDERINGS4);
				for (uint32_t q = 0; q < q_total; q++)
				{
					const uint32_t s = (flags & cEncodeBC1Exhaustive) ? q : g_best_total_orderings4[orig_total_order_index][q];
	
					int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

					vec3F xl, xh;

					if ((s == TOTAL_ORDER_4_0_16) || (s == TOTAL_ORDER_4_1_16) || (s == TOTAL_ORDER_4_2_16) || (s == TOTAL_ORDER_4_3_16))
					{
						trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
						trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
						trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

						trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
						trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
						trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;
					}
					else
					{
						compute_least_squares_endpoints4_rgb(&xl, &xh, total_r, total_g, total_b, 
							g_selector_factors4[s][0], g_selector_factors4[s][1], g_selector_factors4[s][2], s, r_sum, g_sum, b_sum);
				
						precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
					}
										
					uint8_t trial_sels[16];
					
					uint32_t trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, cur_err);

					if (trial_err < cur_err)
					{
						cur_err = trial_err;

						lr = trial_lr;
						lg = trial_lg;
						lb = trial_lb;

						hr = trial_hr;
						hg = trial_hg;
						hb = trial_hb;

						memcpy(sels, trial_sels, 16);
					}

				} // s

				if ((!cur_err) || (cur_err == orig_err))
					break;
			
			} // iter_index
		}
												
		if ( ((flags & (cEncodeBC1Use3ColorBlocks | cEncodeBC1Use3ColorBlocksForBlackPixels)) != 0) && (cur_err) )
		{
			if (flags & cEncodeBC1Use3ColorBlocks)
			{
				assert(needs_block_error);
				try_3color_block(pSrc_pixels, flags, cur_err, avg_r, avg_g, avg_b, orig_lr, orig_lg, orig_lb, orig_hr, orig_hg, orig_hb, total_r, total_g, total_b, total_orderings_to_try3, results);
			}

			if ((any_black_pixels) && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0))
			{
				assert(needs_block_error);
				try_3color_block_useblack(pSrc_pixels, flags, cur_err, results);
			}
		}
		
		if ( (flags & cEncodeBC1EndpointSearchRoundsMask) && (cur_err)  )
		{
			assert(needs_block_error);

			encode_bc1_endpoint_search(pSrc_pixels, any_black_pixels != 0, flags, results, cur_err);
		}

		if (results.m_3color)
			bc1_encode3(pDst_block, results.lr, results.lg, results.lb, results.hr, results.hg, results.hb, results.sels);
		else
			bc1_encode4(pDst_block, results.lr, results.lg, results.lb, results.hr, results.hg, results.hb, results.sels);
	}